

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

int nng_url_parse(nng_url **urlp,char *raw)

{
  int iVar1;
  nng_url *url;
  
  url = (nng_url *)nni_zalloc(200);
  if (url == (nng_url *)0x0) {
    iVar1 = 2;
  }
  else {
    iVar1 = nni_url_parse_inline(url,raw);
    if (iVar1 == 0) {
      *urlp = url;
      iVar1 = 0;
    }
    else {
      nni_free(url,200);
    }
  }
  return iVar1;
}

Assistant:

int
nng_url_parse(nng_url **urlp, const char *raw)
{
	nng_url *url;
	int      rv;

	if ((url = NNI_ALLOC_STRUCT(url)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = nni_url_parse_inline(url, raw)) != 0) {
		NNI_FREE_STRUCT(url);
		return (rv);
	}
	*urlp = url;
	return (0);
}